

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void do_oedit(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  OBJ_INDEX_DATA *pOVar4;
  AREA_DATA_conflict *pAVar5;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var6;
  int value;
  char arg1 [4608];
  AREA_DATA_conflict *pArea;
  OBJ_INDEX_DATA *pObj;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedd0;
  int iVar7;
  undefined4 in_stack_ffffffffffffedd8;
  int in_stack_ffffffffffffeddc;
  char *in_stack_ffffffffffffede0;
  CHAR_DATA *in_stack_ffffffffffffede8;
  
  iVar7 = 0;
  bVar1 = is_npc(in_stack_ffffffffffffedc8);
  if ((!bVar1) && (bVar1 = check_security(in_stack_ffffffffffffedc8), bVar1)) {
    pcVar3 = one_argument((char *)CONCAT44(iVar7,in_stack_ffffffffffffedd0),
                          (char *)in_stack_ffffffffffffedc8);
    iVar2 = strcmp(&stack0xffffffffffffedd8,"");
    if ((iVar2 == 0) && (0 < in_RDI->pcdata->editing_item)) {
      iVar7 = in_RDI->pcdata->editing_item;
    }
    bVar1 = is_number((char *)in_stack_ffffffffffffedc8);
    if ((bVar1) || (0 < iVar7)) {
      if (iVar7 == 0) {
        iVar7 = atoi(&stack0xffffffffffffedd8);
      }
      pOVar4 = get_obj_index(in_stack_ffffffffffffeddc);
      if (pOVar4 == (OBJ_INDEX_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffffede0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
      }
      else {
        bVar1 = is_switched(in_RDI);
        if ((bVar1) ||
           (((pOVar4->area->security < in_RDI->pcdata->security ||
             (pcVar3 = strstr(pOVar4->area->builders,in_RDI->name), pcVar3 == (char *)0x0)) &&
            ((in_RDI->pcdata->security <= pOVar4->area->security &&
             (pcVar3 = strstr(pOVar4->area->builders,"All"), pcVar3 == (char *)0x0)))))) {
          send_to_char(in_stack_ffffffffffffede0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
        }
        else {
          in_RDI->desc->pEdit = pOVar4;
          in_RDI->pcdata->editing_item = iVar7;
          in_RDI->desc->editor = 3;
          oedit_show((CHAR_DATA *)arg1._504_8_,(char *)arg1._496_8_);
        }
      }
    }
    else {
      bVar1 = str_cmp(&stack0xffffffffffffedd8,"create");
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffede0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
      }
      else {
        iVar7 = atoi(pcVar3);
        if ((*pcVar3 == '\0') || (iVar7 == 0)) {
          send_to_char(in_stack_ffffffffffffede0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
        }
        else {
          pAVar5 = get_vnum_area(iVar7);
          if (pAVar5 == (AREA_DATA_conflict *)0x0) {
            send_to_char(in_stack_ffffffffffffede0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8))
            ;
          }
          else {
            bVar1 = is_switched(in_RDI);
            if ((bVar1) ||
               ((((pAVar5->security < in_RDI->pcdata->security ||
                  (pcVar3 = strstr(pAVar5->builders,in_RDI->name), pcVar3 == (char *)0x0)) &&
                 (in_RDI->pcdata->security <= pAVar5->security)) &&
                (pcVar3 = strstr(pAVar5->builders,"All"), pcVar3 == (char *)0x0)))) {
              send_to_char(in_stack_ffffffffffffede0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
            }
            else {
              bVar1 = oedit_create(in_stack_ffffffffffffede8,in_stack_ffffffffffffede0);
              if (bVar1) {
                _Var6 = std::pow<int,int>(0,0x76f612);
                pAVar5->area_flags[0] = (long)_Var6 | pAVar5->area_flags[0];
                in_RDI->desc->editor = 3;
                oedit_show((CHAR_DATA *)arg1._504_8_,(char *)arg1._496_8_);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_oedit(CHAR_DATA *ch, char *argument)
{
	OBJ_INDEX_DATA *pObj;
	AREA_DATA *pArea;
	char arg1[MAX_STRING_LENGTH];
	int value = 0;

	if (is_npc(ch))
		return;

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	if (!strcmp(arg1, "") && ch->pcdata->editing_item > 0)
		value = ch->pcdata->editing_item;

	if (is_number(arg1) || value > 0)
	{
		if (value == 0)
			value = atoi(arg1);

		if (!(pObj = get_obj_index(value)))
		{
			send_to_char("OEdit:  That vnum does not exist.\n\r", ch);
			return;
		}

		if (!IS_BUILDER(ch, pObj->area))
		{
			send_to_char("Insufficient security to modify object.\n\r", ch);
			return;
		}

		ch->desc->pEdit = (void *)pObj;
		ch->pcdata->editing_item = value;
		ch->desc->editor = ED_OBJECT;

		oedit_show(ch, "");
		return;
	}
	else
	{
		if (!str_cmp(arg1, "create"))
		{
			value = atoi(argument);

			if (argument[0] == '\0' || value == 0)
			{
				send_to_char("Syntax:  edit object create [vnum]\n\r", ch);
				return;
			}

			pArea = get_vnum_area(value);

			if (!pArea)
			{
				send_to_char("OEdit:  That vnum is not assigned an area.\n\r", ch);
				return;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("Insufficient security to modify object.\n\r", ch);
				return;
			}

			if (oedit_create(ch, argument))
			{
				SET_BIT(pArea->area_flags, AREA_CHANGED);
				ch->desc->editor = ED_OBJECT;
				oedit_show(ch, "");
			}

			return;
		}
	}

	send_to_char("OEdit:  There is no default object to edit.\n\r", ch);
}